

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64emithelper.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::a64::EmitHelper::emitEpilog(EmitHelper *this,FuncFrame *frame)

{
  Error EVar1;
  Reg *pRVar2;
  LoadStoreInstructions *pLVar3;
  RegPair *pRVar4;
  EVP_PKEY_CTX *in_RSI;
  long in_RDI;
  Error _err_6;
  Error _err_5;
  Error _err_4;
  RegPair *pair;
  int i;
  LoadStoreInstructions *insts;
  Mem mem;
  Reg regs [2];
  uint32_t pairCount;
  GroupData *data;
  RegGroup group;
  int g;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  uint32_t adj;
  uint32_t adjustInitialOffset;
  Error _err;
  PrologEpilogInfo pei;
  Emitter *emitter;
  Operand_ *in_stack_fffffffffffffb08;
  Operand_ *in_stack_fffffffffffffb10;
  EmitterExplicitT<asmjit::v1_14::a64::Emitter> *in_stack_fffffffffffffb18;
  undefined8 *puVar5;
  undefined8 *puVar6;
  InstId instId;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  uint32_t local_4c4;
  Operand_ local_4b8;
  ulong local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  uint32_t local_484;
  GroupData *local_480;
  undefined1 local_471;
  int local_470;
  uint local_46c;
  undefined4 local_468;
  undefined4 local_464;
  uint local_460;
  undefined4 local_45c;
  undefined4 local_458;
  uint local_454;
  undefined4 local_450;
  undefined4 local_44c;
  uint local_448;
  undefined4 local_444;
  Error local_440;
  undefined4 local_43c;
  undefined4 local_438;
  uint local_434;
  undefined4 local_430;
  undefined4 local_42c;
  uint local_428;
  uint32_t local_424;
  Error local_420;
  PrologEpilogInfo local_41c;
  undefined8 local_390;
  EVP_PKEY_CTX *local_388;
  Error local_374;
  undefined8 local_370;
  Reg *local_368;
  ulong *local_360;
  Reg *local_358;
  undefined8 *local_350;
  undefined4 local_348;
  undefined4 local_344;
  undefined4 *local_340;
  Operand_ *local_338;
  uint local_32c;
  undefined8 *local_328;
  uint local_31c;
  ulong *local_318;
  Operand_ *local_310;
  ulong *local_308;
  InstId local_2fc;
  undefined8 local_2f8;
  Operand_ *local_2f0;
  undefined8 *local_2e8;
  ulong *local_2e0;
  InstId local_2d4;
  undefined8 local_2d0;
  Operand_ *local_2c8;
  EVP_PKEY_CTX *local_2c0;
  EVP_PKEY_CTX *local_2b8;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined4 local_2a4;
  uint *local_2a0;
  undefined4 *local_298;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 local_284;
  uint *local_280;
  undefined4 *local_278;
  undefined4 local_270;
  undefined4 local_26c;
  undefined4 local_268;
  undefined4 local_264;
  uint *local_260;
  undefined4 *local_258;
  Operand_ *local_250;
  Reg *local_248;
  undefined8 *local_240;
  Reg *local_238;
  ulong *local_230;
  undefined4 local_224;
  uint local_220;
  undefined4 local_21c;
  undefined4 *local_218;
  undefined4 *local_210;
  undefined4 local_204;
  uint local_200;
  undefined4 local_1fc;
  undefined4 *local_1f8;
  undefined4 *local_1f0;
  undefined4 local_1e4;
  uint local_1e0;
  undefined4 local_1dc;
  undefined4 *local_1d8;
  undefined4 *local_1d0;
  undefined4 local_1c4;
  undefined4 local_1c0;
  uint local_1bc;
  uint local_1b8;
  undefined4 local_1b4;
  undefined4 *local_1b0;
  Operand_ *local_1a8;
  undefined4 local_19c;
  undefined4 *local_198;
  undefined4 *local_190;
  undefined4 *local_188;
  undefined4 *local_180;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 local_16c;
  undefined4 local_168;
  undefined4 local_164;
  undefined4 local_160;
  undefined4 local_15c;
  undefined4 *local_158;
  uint *local_150;
  uint local_144;
  undefined4 *local_140;
  undefined4 *local_138;
  uint local_12c;
  undefined4 *local_128;
  undefined4 *local_120;
  undefined4 local_114;
  undefined4 *local_110;
  undefined4 *local_108;
  
  local_390 = *(undefined8 *)(in_RDI + 8);
  local_388 = in_RSI;
  local_370 = local_390;
  local_420 = PrologEpilogInfo::init(&local_41c,in_RSI);
  if (local_420 != 0) {
    return local_420;
  }
  local_424 = local_41c.sizeTotal;
  local_2c0 = local_388;
  if (*(int *)(local_388 + 0x2c) != 0) {
    local_2b8 = local_388;
    local_428 = *(uint *)(local_388 + 0x2c);
    if (local_428 < 0x1000) {
      local_298 = &local_43c;
      local_2a0 = &local_428;
      local_2a4 = 0;
      local_160 = 4;
      local_15c = 4;
      local_2ac = 4;
      local_2b0 = 0;
      local_2a8 = 4;
      local_1d8 = &local_2a8;
      local_1dc = 0;
      local_1e4 = 0;
      local_43c = 4;
      local_438 = 0;
      local_430 = 0;
      local_1e0 = local_428;
      local_1d0 = local_298;
      local_434 = local_428;
      EVar1 = EmitterExplicitT<asmjit::v1_14::a64::Emitter>::add
                        (in_stack_fffffffffffffb18,(Gp *)in_stack_fffffffffffffb10,
                         (Gp *)in_stack_fffffffffffffb08,(Imm *)0x1911cc);
      if (EVar1 != 0) {
        return EVar1;
      }
      local_42c = 0;
    }
    else {
      if (0xffffff < local_428) {
        EVar1 = DebugUtils::errored(3);
        return EVar1;
      }
      local_454 = local_428 & 0xfff;
      local_278 = &local_450;
      local_280 = &local_454;
      local_284 = 0;
      local_168 = 4;
      local_164 = 4;
      local_28c = 4;
      local_290 = 0;
      local_108 = &local_28c;
      local_110 = &local_290;
      local_288 = 4;
      local_1f8 = &local_288;
      local_1fc = 0;
      local_204 = 0;
      local_450 = 4;
      local_44c = 0;
      local_444 = 0;
      local_200 = local_454;
      local_1f0 = local_278;
      local_448 = local_454;
      local_440 = EmitterExplicitT<asmjit::v1_14::a64::Emitter>::add
                            (in_stack_fffffffffffffb18,(Gp *)in_stack_fffffffffffffb10,
                             (Gp *)in_stack_fffffffffffffb08,(Imm *)0x1913be);
      if (local_440 != 0) {
        return local_440;
      }
      local_46c = local_428 & 0xfff000;
      local_258 = &local_468;
      local_260 = &local_46c;
      local_264 = 0;
      local_170 = 4;
      local_16c = 4;
      local_26c = 4;
      local_270 = 0;
      local_120 = &local_26c;
      local_128 = &local_270;
      local_268 = 4;
      local_218 = &local_268;
      local_21c = 0;
      local_224 = 0;
      local_468 = 4;
      local_464 = 0;
      local_45c = 0;
      local_220 = local_46c;
      local_210 = local_258;
      local_114 = local_268;
      local_460 = local_46c;
      EVar1 = EmitterExplicitT<asmjit::v1_14::a64::Emitter>::add
                        (in_stack_fffffffffffffb18,(Gp *)in_stack_fffffffffffffb10,
                         (Gp *)in_stack_fffffffffffffb08,(Imm *)0x19159a);
      if (EVar1 != 0) {
        return EVar1;
      }
      local_458 = 0;
    }
  }
  local_470 = 1;
  do {
    if (local_470 < 0) {
      local_374 = EmitterExplicitT<asmjit::v1_14::a64::Emitter>::ret
                            ((EmitterExplicitT<asmjit::v1_14::a64::Emitter> *)
                             in_stack_fffffffffffffb08,(Gp *)0x191d4a);
      if (local_374 == 0) {
        local_374 = 0;
      }
      return local_374;
    }
    local_471 = (undefined1)local_470;
    local_480 = Support::Array<asmjit::v1_14::a64::PrologEpilogInfo::GroupData,_2UL>::
                operator[]<asmjit::v1_14::RegGroup>
                          ((Array<asmjit::v1_14::a64::PrologEpilogInfo::GroupData,_2UL> *)
                           in_stack_fffffffffffffb10,(RegGroup *)in_stack_fffffffffffffb08);
    local_484 = local_480->pairCount;
    local_368 = Support::Array<asmjit::v1_14::arm::Reg,_2UL>::operator[]<asmjit::v1_14::RegGroup>
                          ((Array<asmjit::v1_14::arm::Reg,_2UL> *)in_stack_fffffffffffffb10,
                           (RegGroup *)in_stack_fffffffffffffb08);
    local_360 = &local_4a8;
    local_4a8._0_4_ = (local_368->super_BaseReg).super_Operand.super_Operand_._signature;
    local_4a8._4_4_ = (local_368->super_BaseReg).super_Operand.super_Operand_._baseId;
    local_4a0 = *(undefined8 *)(local_368->super_BaseReg).super_Operand.super_Operand_._data;
    puVar5 = &local_498;
    local_238 = local_368;
    local_230 = local_360;
    pRVar2 = Support::Array<asmjit::v1_14::arm::Reg,_2UL>::operator[]<asmjit::v1_14::RegGroup>
                       ((Array<asmjit::v1_14::arm::Reg,_2UL> *)in_stack_fffffffffffffb10,
                        (RegGroup *)in_stack_fffffffffffffb08);
    puVar6 = puVar5;
    local_358 = pRVar2;
    local_350 = puVar5;
    local_248 = pRVar2;
    local_240 = puVar5;
    *puVar5 = *(undefined8 *)&(pRVar2->super_BaseReg).super_Operand.super_Operand_;
    puVar5[1] = *(undefined8 *)(pRVar2->super_BaseReg).super_Operand.super_Operand_._data;
    local_338 = &local_4b8;
    local_340 = &a64::regs::sp;
    local_344 = 0;
    local_348 = 0;
    local_19c = 0;
    local_1a8 = &local_4b8;
    local_1b0 = &a64::regs::sp;
    local_1b4 = 0;
    local_178 = 2;
    local_174 = 2;
    local_1c0 = 2;
    local_198 = &a64::regs::sp;
    local_188 = &a64::regs::sp;
    local_180 = &a64::regs::sp;
    local_1c4 = 0x38;
    local_138 = &local_1c0;
    local_140 = &local_1c4;
    local_1bc = 0x3a;
    local_150 = &local_1bc;
    local_158 = &local_19c;
    local_190 = &a64::regs::sp;
    local_4b8._baseId = 0x1f;
    local_4b8._data[0] = 0;
    local_4b8._data[1] = 0;
    local_1b8 = local_1bc;
    local_144 = local_1bc;
    local_12c = local_1bc;
    local_4b8._signature._bits = local_1bc;
    pLVar3 = Support::Array<asmjit::v1_14::a64::LoadStoreInstructions,_2UL>::
             operator[]<asmjit::v1_14::RegGroup>
                       ((Array<asmjit::v1_14::a64::LoadStoreInstructions,_2UL> *)
                        in_stack_fffffffffffffb10,(RegGroup *)in_stack_fffffffffffffb08);
    local_4c4 = local_484;
    while (local_4c4 = local_4c4 - 1, -1 < (int)local_4c4) {
      pRVar4 = local_480->pairs + (int)local_4c4;
      local_318 = &local_4a8;
      local_31c = (uint)pRVar4->ids[0];
      local_4a8 = (ulong)CONCAT14(pRVar4->ids[0],(undefined4)local_4a8);
      local_328 = &local_498;
      local_32c = (uint)pRVar4->ids[1];
      local_498._4_4_ = local_32c;
      BaseMem::setOffsetLo32((BaseMem *)&local_4b8,(uint)pRVar4->offset);
      if ((pRVar4->offset == 0) && (local_424 != 0)) {
        BaseMem::setOffset((BaseMem *)&local_4b8,(long)(int)local_424);
        in_stack_fffffffffffffb10 = &local_4b8;
        local_4b8._signature._bits = local_4b8._signature._bits & 0xfcffffff | 0x2000000;
        local_250 = in_stack_fffffffffffffb10;
      }
      instId = (InstId)((ulong)puVar6 >> 0x20);
      if (pRVar4->ids[1] == 0xff) {
        local_2fc = pLVar3->singleInstId;
        local_308 = &local_4a8;
        local_2f8 = local_390;
        local_310 = &local_4b8;
        EVar1 = BaseEmitter::_emitI((BaseEmitter *)
                                    CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                    instId,in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
      }
      else {
        local_2d4 = pLVar3->pairInstId;
        local_2e0 = &local_4a8;
        local_2e8 = &local_498;
        local_2d0 = local_390;
        local_2f0 = &local_4b8;
        EVar1 = BaseEmitter::_emitI((BaseEmitter *)
                                    CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                    instId,in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                                    (Operand_ *)0x191c63);
      }
      if (EVar1 != 0) {
        return EVar1;
      }
      in_stack_fffffffffffffb08 = &local_4b8;
      local_4b8._signature._bits = local_4b8._signature._bits & 0xfcffffff;
      local_2c8 = in_stack_fffffffffffffb08;
    }
    local_470 = local_470 + -1;
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SIZE Error EmitHelper::emitEpilog(const FuncFrame& frame) {
  Emitter* emitter = _emitter->as<Emitter>();

  PrologEpilogInfo pei;
  ASMJIT_PROPAGATE(pei.init(frame));

  static const Support::Array<Reg, 2> groupRegs = {{ x0, d0 }};
  static const Support::Array<LoadStoreInstructions, 2> groupInsts = {{
    { Inst::kIdLdr  , Inst::kIdLdp   },
    { Inst::kIdLdr_v, Inst::kIdLdp_v }
  }};

  uint32_t adjustInitialOffset = pei.sizeTotal;

  if (frame.hasStackAdjustment()) {
    uint32_t adj = frame.stackAdjustment();
    if (adj <= 0xFFFu) {
      ASMJIT_PROPAGATE(emitter->add(sp, sp, adj));
    }
    else if (adj <= 0xFFFFFFu)  {
      ASMJIT_PROPAGATE(emitter->add(sp, sp, adj & 0x000FFFu));
      ASMJIT_PROPAGATE(emitter->add(sp, sp, adj & 0xFFF000u));
    }
    else {
      return DebugUtils::errored(kErrorInvalidState);
    }
  }

  for (int g = 1; g >= 0; g--) {
    RegGroup group = RegGroup(g);
    const PrologEpilogInfo::GroupData& data = pei.groups[group];
    uint32_t pairCount = data.pairCount;

    Reg regs[2] = { groupRegs[group], groupRegs[group] };
    Mem mem = ptr(sp);

    const LoadStoreInstructions& insts = groupInsts[group];

    for (int i = int(pairCount) - 1; i >= 0; i--) {
      const PrologEpilogInfo::RegPair& pair = data.pairs[i];

      regs[0].setId(pair.ids[0]);
      regs[1].setId(pair.ids[1]);
      mem.setOffsetLo32(pair.offset);

      if (pair.offset == 0 && adjustInitialOffset) {
        mem.setOffset(int(adjustInitialOffset));
        mem.makePostIndex();
      }

      if (pair.ids[1] == BaseReg::kIdBad)
        ASMJIT_PROPAGATE(emitter->emit(insts.singleInstId, regs[0], mem));
      else
        ASMJIT_PROPAGATE(emitter->emit(insts.pairInstId, regs[0], regs[1], mem));

      mem.resetOffsetMode();
    }
  }

  ASMJIT_PROPAGATE(emitter->ret(x30));

  return kErrorOk;
}